

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

void __thiscall
ProString::
ProString<QStringBuilder<QStringBuilder<char_const(&)[9],QString>,char_const(&)[5]>,QString>
          (ProString *this,
          QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[9],_QString>,_const_char_(&)[5]>,_QString>
          *str)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[9],_QString>,_const_char_(&)[5]>,_QString>
  ::convertTo<QString>((QString *)&local_30,str);
  ProString(this,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProString(const QStringBuilder<A, B> &str)
        : ProString(QString(str))
    {}